

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genGroupRelationOrdering
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,size_t *depth,
          size_t *group_id)

{
  size_t sVar1;
  unsigned_long uVar2;
  Attribute *pAVar3;
  size_t sVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  CppGenerator *this_00;
  string *psVar6;
  string *psStack_9a0;
  string secondID;
  string second;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string firstID;
  string first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  string *local_888;
  CppGenerator *local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  long local_858;
  string *local_850;
  string local_848;
  string local_828;
  string local_808;
  size_t *local_7e8;
  string local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  size_t *local_7b8;
  string attrType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  string depthString;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_888 = rel_name;
  offset_abi_cxx11_(&attrType,this,*depth + 2);
  std::operator+(__return_storage_ptr__,&attrType,"/*********** ORDERING RELATIONS *************/\n"
                );
  std::__cxx11::string::~string((string *)&attrType);
  this_00 = (CppGenerator *)
            this->groupVariableOrder[*group_id].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*depth];
  pAVar3 = TreeDecomposition::getAttribute
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(size_t)this_00);
  typeToStr_abi_cxx11_(&attrType,this_00,pAVar3->_type);
  std::__cxx11::to_string(&depthString,*depth);
  sVar1 = *depth;
  sVar4 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  __rhs = &pAVar3->_name;
  lVar5 = (sVar4 + 2) * sVar1;
  local_850 = (string *)
              this->groupViewsPerVarInfo[*group_id].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
  local_858 = lVar5;
  if (local_850 == (string *)0x2) {
    first._M_dataplus._M_p = (pointer)&first.field_2;
    first._M_string_length = 0;
    first.field_2._M_local_buf[0] = '\0';
    firstID._M_dataplus._M_p = (pointer)&firstID.field_2;
    firstID._M_string_length = 0;
    firstID.field_2._M_local_buf[0] = '\0';
    sVar1 = this->groupViewsPerVarInfo[*group_id].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5 + 1];
    sVar4 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    psVar6 = local_888;
    if (sVar1 == sVar4) {
      std::operator+(&local_8c8,local_888,"[lowerptr_");
      std::operator+(&local_8a8,&local_8c8,psVar6);
      std::operator+(&local_948,&local_8a8,"[");
      std::operator+(&local_928,&local_948,&depthString);
      std::operator+(&secondID,&local_928,"]].");
      std::operator+(&second,&secondID,__rhs);
      std::__cxx11::string::operator=((string *)&first,(string *)&second);
      std::__cxx11::string::~string((string *)&second);
      std::__cxx11::string::~string((string *)&secondID);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::operator+(&second,local_888,"_ID");
      std::__cxx11::string::operator=((string *)&firstID,(string *)&second);
      std::__cxx11::string::~string((string *)&second);
    }
    else {
      uVar2 = this->groupViewsPerVarInfo[*group_id].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_858 + 1];
      std::operator+(&local_8c8,this->viewName + uVar2,"[lowerptr_");
      std::operator+(&local_8a8,&local_8c8,this->viewName + uVar2);
      std::operator+(&local_948,&local_8a8,"[");
      std::operator+(&local_928,&local_948,&depthString);
      std::operator+(&secondID,&local_928,"]].");
      local_7e8 = group_id;
      std::operator+(&second,&secondID,__rhs);
      std::__cxx11::string::operator=((string *)&first,(string *)&second);
      std::__cxx11::string::~string((string *)&second);
      std::__cxx11::string::~string((string *)&secondID);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::operator+(&second,this->viewName + uVar2,"_ID");
      std::__cxx11::string::operator=((string *)&firstID,(string *)&second);
      std::__cxx11::string::~string((string *)&second);
      group_id = local_7e8;
    }
    uVar2 = this->groupViewsPerVarInfo[*group_id].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_858 + 2];
    std::operator+(&local_8c8,this->viewName + uVar2,"[lowerptr_");
    std::operator+(&local_8a8,&local_8c8,this->viewName + uVar2);
    std::operator+(&local_948,&local_8a8,"[");
    std::operator+(&local_928,&local_948,&depthString);
    std::operator+(&secondID,&local_928,"]].");
    std::operator+(&second,&secondID,__rhs);
    std::__cxx11::string::~string((string *)&secondID);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::operator+(&secondID,this->viewName + uVar2,"_ID");
    offset_abi_cxx11_(&local_4f0,this,*depth + 2);
    std::operator+(&local_4d0,&local_4f0,"std::pair<");
    std::operator+(&local_4b0,&local_4d0,&attrType);
    std::operator+(&local_490,&local_4b0,", int> order_");
    std::operator+(&local_470,&local_490,__rhs);
    std::operator+(&local_450,&local_470,"[");
    std::__cxx11::to_string(&local_510,2);
    std::operator+(&local_430,&local_450,&local_510);
    std::operator+(&local_410,&local_430,"];\n");
    offset_abi_cxx11_(&local_530,this,*depth + 2);
    std::operator+(&local_3f0,&local_410,&local_530);
    std::operator+(&local_3d0,&local_3f0,"if(");
    std::operator+(&local_3b0,&local_3d0,&first);
    std::operator+(&local_390,&local_3b0," < ");
    std::operator+(&local_370,&local_390,&second);
    std::operator+(&local_350,&local_370,")\n");
    offset_abi_cxx11_(&local_550,this,*depth + 2);
    std::operator+(&local_330,&local_350,&local_550);
    std::operator+(&local_310,&local_330,"{\n");
    offset_abi_cxx11_(&local_570,this,*depth + 3);
    std::operator+(&local_2f0,&local_310,&local_570);
    std::operator+(&local_2d0,&local_2f0,"order_");
    std::operator+(&local_2b0,&local_2d0,__rhs);
    std::operator+(&local_290,&local_2b0,"[0] = std::make_pair(");
    std::operator+(&local_270,&local_290,&first);
    std::operator+(&local_250,&local_270,", ");
    std::operator+(&local_230,&local_250,&firstID);
    std::operator+(&local_210,&local_230,");\n");
    offset_abi_cxx11_(&local_590,this,*depth + 3);
    std::operator+(&local_1f0,&local_210,&local_590);
    std::operator+(&local_1d0,&local_1f0,"order_");
    std::operator+(&local_1b0,&local_1d0,__rhs);
    std::operator+(&local_190,&local_1b0,"[1] = std::make_pair(");
    std::operator+(&local_170,&local_190,&second);
    std::operator+(&local_150,&local_170,", ");
    std::operator+(&local_130,&local_150,&secondID);
    std::operator+(&local_110,&local_130,");\n");
    offset_abi_cxx11_(&local_5b0,this,*depth + 2);
    std::operator+(&local_f0,&local_110,&local_5b0);
    std::operator+(&local_d0,&local_f0,"}\n");
    offset_abi_cxx11_(&local_5d0,this,*depth + 2);
    std::operator+(&local_b0,&local_d0,&local_5d0);
    std::operator+(&local_90,&local_b0,"else\n");
    offset_abi_cxx11_(&local_5f0,this,*depth + 2);
    std::operator+(&local_70,&local_90,&local_5f0);
    std::operator+(&local_50,&local_70,"{\n");
    offset_abi_cxx11_(&local_610,this,*depth + 3);
    std::operator+(&local_790,&local_50,&local_610);
    std::operator+(&local_770,&local_790,"order_");
    std::operator+(&local_750,&local_770,__rhs);
    std::operator+(&local_730,&local_750,"[0] = std::make_pair(");
    std::operator+(&local_710,&local_730,&second);
    std::operator+(&local_6f0,&local_710,", ");
    std::operator+(&local_6d0,&local_6f0,&secondID);
    std::operator+(&local_6b0,&local_6d0,");\n");
    offset_abi_cxx11_(&local_630,this,*depth + 3);
    std::operator+(&local_690,&local_6b0,&local_630);
    std::operator+(&local_7e0,&local_690,"order_");
    std::operator+(&local_848,&local_7e0,__rhs);
    std::operator+(&local_828,&local_848,"[1] = std::make_pair(");
    std::operator+(&local_808,&local_828,&first);
    std::operator+(&local_878,&local_808,", ");
    std::operator+(&local_8c8,&local_878,&firstID);
    std::operator+(&local_8a8,&local_8c8,");\n");
    offset_abi_cxx11_(&local_650,this,*depth + 2);
    std::operator+(&local_948,&local_8a8,&local_650);
    std::operator+(&local_928,&local_948,"}\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&secondID);
    std::__cxx11::string::~string((string *)&second);
    std::__cxx11::string::~string((string *)&firstID);
    psVar6 = &first;
  }
  else {
    offset_abi_cxx11_(&local_808,this,*depth + 2);
    std::operator+(&local_878,&local_808,"std::pair<");
    std::operator+(&local_8c8,&local_878,&attrType);
    std::operator+(&local_8a8,&local_8c8,", int> order_");
    std::operator+(&local_948,&local_8a8,__rhs);
    std::operator+(&local_928,&local_948,"[");
    std::__cxx11::to_string(&local_828,(unsigned_long)local_850);
    std::operator+(&secondID,&local_928,&local_828);
    std::operator+(&second,&secondID,"] = \n");
    offset_abi_cxx11_(&local_848,this,*depth + 3);
    std::operator+(&firstID,&second,&local_848);
    std::operator+(&first,&firstID,"{");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&first);
    std::__cxx11::string::~string((string *)&firstID);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&second);
    std::__cxx11::string::~string((string *)&secondID);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_808);
    sVar1 = this->groupViewsPerVarInfo[*group_id].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5 + 1];
    sVar4 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    local_880 = this;
    local_7c0 = __rhs;
    local_7b8 = depth;
    if (sVar1 == sVar4) {
      local_7e8 = group_id;
      offset_abi_cxx11_(&local_7e0,this,*depth + 4);
      std::operator+(&local_848,"\n",&local_7e0);
      psVar6 = local_888;
      std::operator+(&local_828,&local_848,"std::make_pair(");
      std::operator+(&local_808,&local_828,psVar6);
      std::operator+(&local_878,&local_808,"[lowerptr_");
      std::operator+(&local_8c8,&local_878,psVar6);
      std::operator+(&local_8a8,&local_8c8,"[");
      std::operator+(&local_948,&local_8a8,&depthString);
      std::operator+(&local_928,&local_948,"]].");
      std::operator+(&secondID,&local_928,__rhs);
      std::operator+(&second,&secondID,", ");
      std::operator+(&firstID,&second,psVar6);
      std::operator+(&first,&firstID,"_ID),");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::~string((string *)&firstID);
      std::__cxx11::string::~string((string *)&second);
      std::__cxx11::string::~string((string *)&secondID);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_7e0);
      psStack_9a0 = (string *)0x2;
    }
    else {
      psStack_9a0 = (string *)0x1;
      local_7e8 = group_id;
    }
    local_858 = local_858 << 3;
    while (psStack_9a0 <= local_850) {
      lVar5 = *(long *)((long)local_880->groupViewsPerVarInfo[*local_7e8].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       (long)psStack_9a0 * 8 + local_858);
      local_888 = psStack_9a0;
      offset_abi_cxx11_(&local_7e0,local_880,*local_7b8 + 4);
      std::operator+(&local_848,"\n",&local_7e0);
      std::operator+(&local_828,&local_848,"std::make_pair(");
      std::operator+(&local_808,&local_828,local_880->viewName + lVar5);
      std::operator+(&local_878,&local_808,"[lowerptr_");
      std::operator+(&local_8c8,&local_878,local_880->viewName + lVar5);
      std::operator+(&local_8a8,&local_8c8,"[");
      std::operator+(&local_948,&local_8a8,&depthString);
      std::operator+(&local_928,&local_948,"]].");
      std::operator+(&secondID,&local_928,local_7c0);
      std::operator+(&second,&secondID,", ");
      std::operator+(&firstID,&second,local_880->viewName + lVar5);
      std::operator+(&first,&firstID,"_ID),");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::~string((string *)&firstID);
      std::__cxx11::string::~string((string *)&second);
      std::__cxx11::string::~string((string *)&secondID);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_7e0);
      psStack_9a0 = (string *)((long)&(local_888->_M_dataplus)._M_p + 1);
    }
    std::__cxx11::string::pop_back();
    depth = local_7b8;
    this = local_880;
    offset_abi_cxx11_(&second,local_880,*local_7b8 + 3);
    std::operator+(&firstID,"\n",&second);
    __rhs = local_7c0;
    std::operator+(&first,&firstID,"};\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&first);
    std::__cxx11::string::~string((string *)&firstID);
    std::__cxx11::string::~string((string *)&second);
    offset_abi_cxx11_(&local_710,this,*depth + 2);
    std::operator+(&local_6f0,&local_710,"std::sort(order_");
    std::operator+(&local_6d0,&local_6f0,__rhs);
    std::operator+(&local_6b0,&local_6d0,", order_");
    std::operator+(&local_690,&local_6b0,__rhs);
    std::operator+(&local_7e0,&local_690," + ");
    std::__cxx11::to_string(&local_730,(unsigned_long)local_850);
    std::operator+(&local_848,&local_7e0,&local_730);
    std::operator+(&local_828,&local_848,",[](const std::pair<");
    std::operator+(&local_808,&local_828,&attrType);
    std::operator+(&local_878,&local_808,",int> &lhs, const std::pair<");
    std::operator+(&local_8c8,&local_878,&attrType);
    std::operator+(&local_8a8,&local_8c8,",int> &rhs)\n");
    offset_abi_cxx11_(&local_750,this,*depth + 3);
    std::operator+(&local_948,&local_8a8,&local_750);
    std::operator+(&local_928,&local_948,"{\n");
    offset_abi_cxx11_(&local_770,this,*depth + 4);
    std::operator+(&secondID,&local_928,&local_770);
    std::operator+(&second,&secondID,"return lhs.first < rhs.first;\n");
    offset_abi_cxx11_(&local_790,this,*depth + 3);
    std::operator+(&firstID,&second,&local_790);
    std::operator+(&first,&firstID,"});\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&first);
    std::__cxx11::string::~string((string *)&firstID);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&second);
    std::__cxx11::string::~string((string *)&secondID);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    psVar6 = &local_710;
  }
  std::__cxx11::string::~string((string *)psVar6);
  offset_abi_cxx11_(&local_948,this,*depth + 2);
  std::operator+(&local_928,&local_948,"min_");
  std::operator+(&secondID,&local_928,__rhs);
  std::operator+(&second,&secondID," = order_");
  std::operator+(&firstID,&second,__rhs);
  std::operator+(&first,&firstID,"[0].first;\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::~string((string *)&firstID);
  std::__cxx11::string::~string((string *)&second);
  std::__cxx11::string::~string((string *)&secondID);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  offset_abi_cxx11_(&local_8c8,this,*depth + 2);
  std::operator+(&local_8a8,&local_8c8,"max_");
  std::operator+(&local_948,&local_8a8,__rhs);
  std::operator+(&local_928,&local_948," = order_");
  std::operator+(&secondID,&local_928,__rhs);
  std::operator+(&second,&secondID,"[");
  std::__cxx11::to_string(&local_878,(unsigned_long)((long)&local_850[-1].field_2 + 0xf));
  std::operator+(&firstID,&second,&local_878);
  std::operator+(&first,&firstID,"].first;\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::~string((string *)&firstID);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&second);
  std::__cxx11::string::~string((string *)&secondID);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  offset_abi_cxx11_(&firstID,this,*depth + 2);
  std::operator+(&first,&firstID,"/*********** ORDERING RELATIONS *************/\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::~string((string *)&firstID);
  std::__cxx11::string::~string((string *)&depthString);
  std::__cxx11::string::~string((string *)&attrType);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genGroupRelationOrdering(
    const std::string& rel_name, const size_t& depth, const size_t& group_id)
{
    // TODO: FIXME: add the case when there is only two or one reations
    std::string res = offset(2+depth)+
        "/*********** ORDERING RELATIONS *************/\n";

    Attribute* attr = _td->getAttribute(groupVariableOrder[group_id][depth]);

    const std::string& attr_name = attr->_name;
    const std::string attrType = typeToStr(attr->_type);
    const std::string depthString = std::to_string(depth);
    
    size_t idx = depth * (_qc->numberOfViews() + 2);
    size_t numberContributing = groupViewsPerVarInfo[group_id][idx];

    if (numberContributing == 2)
    {
        std::string first, firstID;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {    
            first = rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name;
            firstID = rel_name+"_ID";
        }
        else
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+1];
            first = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
            firstID = viewName[viewID]+"_ID";
        }
        size_t viewID = groupViewsPerVarInfo[group_id][idx+2];
        std::string second = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
        std::string secondID = viewName[viewID]+"_ID";

        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"];\n"+
            offset(2+depth)+"if("+first+" < "+second+")\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(2+depth)+"}\n"+
            offset(2+depth)+"else\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(2+depth)+"}\n";
    }
    else
    {
        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"] = \n"+
            offset(3+depth)+"{";
        
        size_t off = 1;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {
            res += "\n"+offset(4+depth)+"std::make_pair("+rel_name+
                "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+", "+
                rel_name+"_ID),";
            off = 2;
        }
        
        for (; off <= numberContributing; ++off)
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+off];
            res += "\n"+offset(4+depth)+"std::make_pair("+viewName[viewID]+
                "[lowerptr_"+viewName[viewID]+"["+depthString+"]]."+
                attr_name+", "+viewName[viewID]+"_ID),";
        }
        res.pop_back();
        res += "\n"+offset(3+depth)+"};\n";
    
        res += offset(2+depth)+"std::sort(order_"+attr_name+", order_"+attr_name+
            " + "+std::to_string(numberContributing)+",[](const std::pair<"+
            attrType+",int> &lhs, const std::pair<"+attrType+",int> &rhs)\n"+
            offset(3+depth)+"{\n"+offset(4+depth)+"return lhs.first < rhs.first;\n"+
            offset(3+depth)+"});\n";
    }
    

    res += offset(2+depth)+"min_"+attr_name+" = order_"+attr_name+"[0].first;\n";
    res += offset(2+depth)+"max_"+attr_name+" = order_"+attr_name+"["+
        std::to_string(numberContributing-1)+"].first;\n";

    res += offset(2+depth)+"/*********** ORDERING RELATIONS *************/\n";
    return res;
}